

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

void __thiscall
duckdb::RowGroupCollection::RemoveFromIndexes
          (RowGroupCollection *this,TableIndexList *indexes,Vector *row_identifiers,idx_t count)

{
  shared_ptr<duckdb::DataTableInfo,_true> *this_00;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *puVar1;
  _Hash_node_base *params;
  long lVar2;
  pointer pSVar3;
  int iVar4;
  type pIVar5;
  ulong uVar6;
  reference pvVar7;
  DataTableInfo *pDVar8;
  Allocator *pAVar9;
  _Hash_node_base *p_Var10;
  RowGroupSegmentTree *this_01;
  RowGroup *this_02;
  idx_t iVar11;
  reference pvVar12;
  reference other;
  BoundIndex *this_03;
  InternalException *pIVar13;
  MissingExtensionException *this_04;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  pointer pSVar14;
  ulong uVar15;
  size_type __n;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *puVar16;
  _Hash_node_base *p_Var17;
  _Hash_node_base *p_Var18;
  idx_t iVar19;
  vector<duckdb::StorageIndex,_true> column_ids;
  vector<duckdb::LogicalType,_true> column_types;
  size_type __dnew;
  SelectionVector sel;
  DataChunk result_chunk;
  DataChunk fetch_chunk;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  indexed_column_id_set;
  TableScanState state;
  ulong local_440;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_428;
  data_ptr_t local_408;
  vector<duckdb::LogicalType,_true> *local_400;
  vector<duckdb::LogicalType,_true> local_3f8;
  vector<bool,_true> local_3e0;
  shared_ptr<duckdb::DataTableInfo,_true> *local_3b8;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *local_3b0;
  Vector *local_3a8;
  Value local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  SelectionVector local_340;
  DataChunk local_328;
  DataChunk local_2e8;
  LogicalType local_2a8;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [40];
  size_t local_230;
  __node_base_ptr p_Stack_228;
  string local_220;
  TableScanState local_200;
  
  local_408 = row_identifiers->data;
  local_258._0_8_ = &p_Stack_228;
  local_258._8_8_ = 1;
  local_258._16_8_ = (_Hash_node_base *)0x0;
  local_258._24_8_ = 0;
  local_258._32_4_ = 1.0;
  local_230 = 0;
  p_Stack_228 = (__node_base_ptr)0x0;
  local_3a8 = row_identifiers;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)indexes);
  if (iVar4 != 0) {
    ::std::__throw_system_error(iVar4);
  }
  puVar16 = (indexes->indexes).
            super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (indexes->indexes).
           super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar16 != puVar1) {
    do {
      pIVar5 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                         (puVar16);
      local_200.table_state.row_group = (RowGroup *)local_258;
      for (p_Var17 = (pIVar5->column_id_set)._M_h._M_before_begin._M_nxt;
          p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
        ::std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_258,p_Var17 + 1,&local_200);
      }
      puVar16 = puVar16 + 1;
    } while (puVar16 != puVar1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)indexes);
  local_428.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((_Hash_node_base *)local_258._16_8_ == (_Hash_node_base *)0x0) {
    local_3f8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3f8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3f8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    p_Var17 = (_Hash_node_base *)local_258._16_8_;
    do {
      ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
      emplace_back<unsigned_long_const&>
                ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)&local_428,
                 (unsigned_long *)(p_Var17 + 1));
      pSVar14 = local_428.
                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pSVar3 = local_428.
               super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
               _M_impl.super__Vector_impl_data._M_start;
      p_Var17 = p_Var17->_M_nxt;
    } while (p_Var17 != (_Hash_node_base *)0x0);
    if (local_428.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_428.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      uVar6 = (long)local_428.
                    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_428.
                    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 5;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::StorageIndex*,std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_428.
                 super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_428.
                 super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      ::std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<duckdb::StorageIndex*,std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pSVar3,pSVar14);
    }
    pSVar3 = local_428.
             super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl
             .super__Vector_impl_data._M_finish;
    local_3f8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3f8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3f8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_428.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_428.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pSVar14 = local_428.
                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        pvVar7 = vector<duckdb::LogicalType,_true>::operator[](&this->types,pSVar14->index);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3f8,
                   pvVar7);
        pSVar14 = pSVar14 + 1;
      } while (pSVar14 != pSVar3);
    }
  }
  TableScanState::TableScanState(&local_200);
  local_290.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_428.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_290.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_428.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_290.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_428.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_428.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TableScanState::Initialize
            (&local_200,(vector<duckdb::StorageIndex,_true> *)&local_290,
             (optional_ptr<duckdb::ClientContext,_true>)0x0,
             (optional_ptr<duckdb::TableFilterSet,_true>)0x0,
             (optional_ptr<duckdb::SampleOptions,_true>)0x0);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_290);
  local_200.table_state.max_row =
       (this->total_rows).super___atomic_base<unsigned_long>._M_i + this->row_start;
  DataChunk::DataChunk(&local_2e8);
  this_00 = &this->info;
  pDVar8 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_00);
  pAVar9 = Allocator::Get(pDVar8->db);
  DataChunk::Initialize(&local_2e8,pAVar9,&local_3f8,0x800);
  DataChunk::DataChunk(&local_328);
  local_3a0.type_._0_8_ = local_3a0.type_._0_8_ & 0xffffffffffffff00;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_3e0,
             ((long)(this->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (bool *)&local_3a0,(allocator_type *)&local_360);
  local_3b8 = this_00;
  pDVar8 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_00);
  pAVar9 = Allocator::Get(pDVar8->db);
  local_400 = &this->types;
  DataChunk::Initialize(&local_328,pAVar9,local_400,&local_3e0,0x800);
  if ((_Hash_node_base *)local_258._16_8_ != (_Hash_node_base *)0x0) {
    p_Var17 = (_Hash_node_base *)
              ((ulong)local_3e0.super_vector<bool,_std::allocator<bool>_>.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_finish.super__Bit_iterator_base._M_offset +
              ((long)local_3e0.super_vector<bool,_std::allocator<bool>_>.
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_finish.super__Bit_iterator_base._M_p -
              (long)local_3e0.super_vector<bool,_std::allocator<bool>_>.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p) * 8);
    p_Var10 = (_Hash_node_base *)local_258._16_8_;
    do {
      params = p_Var10[1]._M_nxt;
      if (p_Var17 <= params) {
        pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
        local_3a0.type_._0_8_ =
             &local_3a0.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3a0,"Attempted to access index %ld within vector of size %ld",""
                  );
        InternalException::InternalException<unsigned_long,unsigned_long>
                  (pIVar13,(string *)&local_3a0,(unsigned_long)params,(unsigned_long)p_Var17);
        __cxa_throw(pIVar13,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      p_Var18 = (_Hash_node_base *)((long)&params[7]._M_nxt + 7);
      if (-1 < (long)params) {
        p_Var18 = params;
      }
      local_3e0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>
      ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
      [((long)p_Var18 >> 6) +
       ((ulong)(((ulong)params & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_3e0.super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base._M_p
           [((long)p_Var18 >> 6) +
            ((ulong)(((ulong)params & 0x800000000000003f) < 0x8000000000000001) - 1)] |
           1L << ((byte)params & 0x3f);
      p_Var10 = p_Var10->_M_nxt;
    } while (p_Var10 != (_Hash_node_base *)0x0);
  }
  SelectionVector::SelectionVector(&local_340,0x800);
  if (count != 0) {
    local_3b0 = &this->row_groups;
    local_440 = 0;
    do {
      DataChunk::Reset(&local_2e8);
      DataChunk::Reset(&local_328);
      iVar11 = *(idx_t *)(local_408 + local_440 * 8);
      this_01 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(local_3b0);
      this_02 = SegmentTree<duckdb::RowGroup,_true>::GetSegment
                          (&this_01->super_SegmentTree<duckdb::RowGroup,_true>,iVar11);
      iVar19 = (this_02->super_SegmentBase<duckdb::RowGroup>).start;
      CollectionScanState::Initialize(&local_200.table_state,local_400);
      uVar6 = iVar11 - iVar19;
      RowGroup::InitializeScanWithOffset(this_02,&local_200.table_state,uVar6 >> 0xb);
      RowGroup::ScanCommitted(this_02,&local_200.table_state,&local_2e8,TABLE_SCAN_COMMITTED_ROWS);
      DataChunk::Verify(&local_2e8);
      iVar11 = count - local_440;
      if (count < local_440 || iVar11 == 0) {
        iVar11 = 0;
        uVar6 = local_440;
      }
      else {
        uVar15 = (uVar6 & 0xfffffffffffff800) + iVar19;
        iVar19 = 0;
        do {
          uVar6 = *(ulong *)(local_408 + iVar19 * 8 + local_440 * 8);
          if ((uVar6 < uVar15) || (local_2e8.count + uVar15 <= uVar6)) {
            iVar11 = iVar19;
            uVar6 = local_440 + iVar19;
            break;
          }
          local_340.sel_vector[iVar19] = (int)uVar6 - (int)uVar15;
          iVar19 = iVar19 + 1;
          uVar6 = count;
        } while (iVar11 != iVar19);
      }
      local_440 = uVar6;
      if ((this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar6 = 0;
        __n = 0;
        do {
          uVar15 = (ulong)local_3e0.super_vector<bool,_std::allocator<bool>_>.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                   ((long)local_3e0.super_vector<bool,_std::allocator<bool>_>.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                   (long)local_3e0.super_vector<bool,_std::allocator<bool>_>.
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p) * 8;
          if (uVar15 <= uVar6) {
            pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
            local_3a0.type_._0_8_ =
                 &local_3a0.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            local_360._M_dataplus._M_p = &DAT_00000037;
            local_3a0.type_._0_8_ =
                 ::std::__cxx11::string::_M_create((ulong *)&local_3a0,(ulong)&local_360);
            local_3a0.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._M_dataplus._M_p;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3a0.type_._0_8_ + 0x20))->_M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x636576206e696874;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3a0.type_._0_8_ + 0x28))->_M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7320666f20726f74;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3a0.type_._0_8_ + 0x10))->_M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x65646e6920737365;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3a0.type_._0_8_ + 0x18))->_M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x697720646c252078;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_3a0.type_._0_8_)->_M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6574706d65747441;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3a0.type_._0_8_ + 8))->_M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x636361206f742064;
            builtin_strncpy((char *)((long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                            (local_3a0.type_._0_8_ + 0x28))->_M_pi + 7),"size %ld",8
                           );
            local_3a0.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_360._M_dataplus._M_p;
            local_360._M_dataplus._M_p[local_3a0.type_._0_8_] = '\0';
            InternalException::InternalException<unsigned_long,unsigned_long>
                      (pIVar13,(string *)&local_3a0,uVar6,uVar15);
            __cxa_throw(pIVar13,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          uVar15 = uVar6 + 0x3f;
          if (-1 < (long)uVar6) {
            uVar15 = uVar6;
          }
          if ((local_3e0.super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_p
               [((long)uVar15 >> 6) +
                ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)] >> (uVar6 & 0x3f)
              & 1) == 0) {
            pvVar12 = vector<duckdb::Vector,_true>::operator[](&local_328.data,uVar6);
            pvVar7 = vector<duckdb::LogicalType,_true>::operator[](local_400,uVar6);
            LogicalType::LogicalType(&local_2a8,pvVar7);
            Value::Value(&local_3a0,&local_2a8);
            Vector::Reference(pvVar12,&local_3a0);
            Value::~Value(&local_3a0);
            LogicalType::~LogicalType(&local_2a8);
          }
          else {
            pvVar12 = vector<duckdb::Vector,_true>::operator[](&local_328.data,uVar6);
            other = vector<duckdb::Vector,_true>::operator[](&local_2e8.data,__n);
            Vector::Reference(pvVar12,other);
            __n = __n + 1;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < (ulong)(((long)(this->types).
                                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                        .
                                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->types).
                                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                        .
                                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x5555555555555555));
      }
      local_328.count = local_2e8.count;
      DataChunk::Slice(&local_328,&local_340,iVar11);
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)indexes);
      if (iVar4 != 0) {
        ::std::__throw_system_error(iVar4);
      }
      puVar1 = (indexes->indexes).
               super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar16 = (indexes->indexes).
                     super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar1;
          puVar16 = puVar16 + 1) {
        this_03 = (BoundIndex *)
                  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                            (puVar16);
        iVar4 = (*(this_03->super_Index)._vptr_Index[2])(this_03);
        if ((char)iVar4 == '\0') {
          this_04 = (MissingExtensionException *)__cxa_allocate_exception(0x10);
          local_3a0.type_._0_8_ =
               &local_3a0.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3a0,
                     "Cannot delete from index \'%s\', unknown index type \'%s\'. You need to load the extension that provides this index type before table \'%s\' can be modified."
                     ,"");
          iVar4 = (*(this_03->super_Index)._vptr_Index[4])(this_03);
          local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
          lVar2 = *(long *)CONCAT44(extraout_var,iVar4);
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_360,lVar2,((long *)CONCAT44(extraout_var,iVar4))[1] + lVar2);
          iVar4 = (*(this_03->super_Index)._vptr_Index[3])(this_03);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          lVar2 = *(long *)CONCAT44(extraout_var_00,iVar4);
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_278,lVar2,((long *)CONCAT44(extraout_var_00,iVar4))[1] + lVar2
                    );
          pDVar8 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(local_3b8);
          DataTableInfo::GetTableName_abi_cxx11_(&local_220,pDVar8);
          MissingExtensionException::
          MissingExtensionException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (this_04,(string *)&local_3a0,&local_360,&local_278,&local_220);
          __cxa_throw(this_04,&MissingExtensionException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        BoundIndex::Delete(this_03,&local_328,local_3a8);
      }
      pthread_mutex_unlock((pthread_mutex_t *)indexes);
    } while (local_440 < count);
  }
  if (local_340.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_340.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_3e0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>
      ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
  {
    operator_delete(local_3e0.super_vector<bool,_std::allocator<bool>_>.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p);
  }
  DataChunk::~DataChunk(&local_328);
  DataChunk::~DataChunk(&local_2e8);
  TableScanState::~TableScanState(&local_200);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3f8);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_428);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_258);
  return;
}

Assistant:

void RowGroupCollection::RemoveFromIndexes(TableIndexList &indexes, Vector &row_identifiers, idx_t count) {
	auto row_ids = FlatVector::GetData<row_t>(row_identifiers);

	// Collect all indexed columns.
	unordered_set<column_t> indexed_column_id_set;
	indexes.Scan([&](Index &index) {
		D_ASSERT(index.IsBound());
		auto &set = index.GetColumnIdSet();
		indexed_column_id_set.insert(set.begin(), set.end());
		return false;
	});
	vector<StorageIndex> column_ids;
	for (auto &col : indexed_column_id_set) {
		column_ids.emplace_back(col);
	}
	sort(column_ids.begin(), column_ids.end());

	vector<LogicalType> column_types;
	for (auto &col : column_ids) {
		column_types.push_back(types[col.GetPrimaryIndex()]);
	}

	// Initialize the fetch state. Only use indexed columns.
	TableScanState state;
	state.Initialize(std::move(column_ids));
	state.table_state.max_row = row_start + total_rows;

	// Used for scanning data. Only contains the indexed columns.
	DataChunk fetch_chunk;
	fetch_chunk.Initialize(GetAllocator(), column_types);

	// Used for index value removal.
	// Contains all columns but only initializes indexed ones.
	DataChunk result_chunk;
	auto fetched_columns = vector<bool>(types.size(), false);
	result_chunk.Initialize(GetAllocator(), types, fetched_columns);

	// Now set all to-be-fetched columns.
	for (auto &col : indexed_column_id_set) {
		fetched_columns[col] = true;
	}

	// Iterate over the row ids.
	SelectionVector sel(STANDARD_VECTOR_SIZE);
	for (idx_t r = 0; r < count;) {
		fetch_chunk.Reset();
		result_chunk.Reset();

		// Figure out which row_group to fetch from.
		auto row_id = row_ids[r];
		auto row_group = row_groups->GetSegment(UnsafeNumericCast<idx_t>(row_id));
		auto row_group_vector_idx = (UnsafeNumericCast<idx_t>(row_id) - row_group->start) / STANDARD_VECTOR_SIZE;
		auto base_row_id = row_group_vector_idx * STANDARD_VECTOR_SIZE + row_group->start;

		// Fetch the current vector into fetch_chunk.
		state.table_state.Initialize(GetTypes());
		row_group->InitializeScanWithOffset(state.table_state, row_group_vector_idx);
		row_group->ScanCommitted(state.table_state, fetch_chunk, TableScanType::TABLE_SCAN_COMMITTED_ROWS);
		fetch_chunk.Verify();

		// Check for any remaining row ids, if they also fall into this vector.
		// We try to fetch as many rows as possible at the same time.
		idx_t sel_count = 0;
		for (; r < count; r++) {
			idx_t current_row = idx_t(row_ids[r]);
			if (current_row < base_row_id || current_row >= base_row_id + fetch_chunk.size()) {
				// This row id does not fall into the current chunk.
				break;
			}
			auto row_in_vector = current_row - base_row_id;
			D_ASSERT(row_in_vector < fetch_chunk.size());
			sel.set_index(sel_count++, row_in_vector);
		}
		D_ASSERT(sel_count > 0);

		// Reference the necessary columns of the fetch_chunk.
		idx_t fetch_idx = 0;
		for (idx_t j = 0; j < types.size(); j++) {
			if (fetched_columns[j]) {
				result_chunk.data[j].Reference(fetch_chunk.data[fetch_idx++]);
				continue;
			}
			result_chunk.data[j].Reference(Value(types[j]));
		}
		result_chunk.SetCardinality(fetch_chunk);

		// Slice the vector with all rows that are present in this vector.
		// Then, erase all values from the indexes.
		result_chunk.Slice(sel, sel_count);
		indexes.Scan([&](Index &index) {
			if (index.IsBound()) {
				index.Cast<BoundIndex>().Delete(result_chunk, row_identifiers);
				return false;
			}
			throw MissingExtensionException(
			    "Cannot delete from index '%s', unknown index type '%s'. You need to load the "
			    "extension that provides this index type before table '%s' can be modified.",
			    index.GetIndexName(), index.GetIndexType(), info->GetTableName());
		});
	}
}